

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fglrx.c
# Opt level: O0

void decode_fglrx_ioctl_4f(fglrx_ioctl_4f *d,mmt_memory_dump *args,int argc)

{
  int iVar1;
  mmt_buf *local_30;
  mmt_buf *__ret;
  mmt_buf *data1;
  int argc_local;
  mmt_memory_dump *args_local;
  fglrx_ioctl_4f *d_local;
  
  if ((d->unk00 != 0) || (iVar1 = _fglrx_field_enabled("unk00"), iVar1 != 0)) {
    fprintf(_stdout,"%sunk00: 0x%08x",fglrx_pfx,(ulong)d->unk00);
  }
  fglrx_pfx = fglrx_sep;
  if ((d->unk04 != 0) || (iVar1 = _fglrx_field_enabled("unk04"), iVar1 != 0)) {
    fprintf(_stdout,"%sunk04: 0x%08x",fglrx_pfx,(ulong)d->unk04);
  }
  fglrx_pfx = fglrx_sep;
  if ((d->unk08 != 0) || (iVar1 = _fglrx_field_enabled("unk08"), iVar1 != 0)) {
    fprintf(_stdout,"%sunk08: 0x%08x",fglrx_pfx,(ulong)d->unk08);
  }
  fglrx_pfx = fglrx_sep;
  if ((d->unk0c != 0) || (iVar1 = _fglrx_field_enabled("unk0c"), iVar1 != 0)) {
    fprintf(_stdout,"%sunk0c: 0x%08x",fglrx_pfx,(ulong)d->unk0c);
  }
  fglrx_pfx = fglrx_sep;
  if ((d->unk10 != 0) || (iVar1 = _fglrx_field_enabled("unk10"), iVar1 != 0)) {
    fprintf(_stdout,"%sunk10: 0x%08x",fglrx_pfx,(ulong)d->unk10);
  }
  fglrx_pfx = fglrx_sep;
  if ((d->unk14 != 0) || (iVar1 = _fglrx_field_enabled("unk14"), iVar1 != 0)) {
    fprintf(_stdout,"%sunk14: 0x%08x",fglrx_pfx,(ulong)d->unk14);
  }
  fglrx_pfx = fglrx_sep;
  if ((d->unk18 != 0) || (iVar1 = _fglrx_field_enabled("unk18"), iVar1 != 0)) {
    fprintf(_stdout,"%sunk18: 0x%08x",fglrx_pfx,(ulong)d->unk18);
  }
  fglrx_pfx = fglrx_sep;
  if ((d->unk1c != 0) || (iVar1 = _fglrx_field_enabled("unk1c"), iVar1 != 0)) {
    fprintf(_stdout,"%sunk1c: 0x%08x",fglrx_pfx,(ulong)d->unk1c);
  }
  fglrx_pfx = fglrx_sep;
  local_30 = (mmt_buf *)0x0;
  if ((d->ptr1 != 0) || (iVar1 = _fglrx_field_enabled("ptr1"), iVar1 != 0)) {
    if (d->ptr1 == 0) {
      fprintf(_stdout,"%sptr1: %s",fglrx_pfx,"NULL");
    }
    else {
      fprintf(_stdout,"%sptr1: 0x%016lx",fglrx_pfx,d->ptr1);
      if (0 < argc) {
        local_30 = find_ptr(d->ptr1,args,argc);
      }
      if (local_30 == (mmt_buf *)0x0) {
        fprintf(_stdout,"%s"," [no data]");
      }
    }
  }
  fglrx_pfx = fglrx_sep;
  fprintf(_stdout,"\n");
  if (mmt_sync_fd != -1) {
    fflush(_stdout);
  }
  if (local_30 != (mmt_buf *)0x0) {
    dump_mmt_buf_as_words_horiz(local_30,"ptr1[]:");
  }
  return;
}

Assistant:

static void decode_fglrx_ioctl_4f(struct fglrx_ioctl_4f *d, struct mmt_memory_dump *args, int argc)
{
	fglrx_print_x32(d, unk00);
	fglrx_print_x32(d, unk04);
	fglrx_print_x32(d, unk08);
	fglrx_print_x32(d, unk0c);
	fglrx_print_x32(d, unk10);
	fglrx_print_x32(d, unk14);
	fglrx_print_x32(d, unk18);
	fglrx_print_x32(d, unk1c);
	struct mmt_buf *data1 = fglrx_print_ptr(d, ptr1, args, argc);
	mmt_log_cont_nl();

	if (data1)
		dump_mmt_buf_as_words_horiz(data1, "ptr1[]:");
}